

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::QGraphicsSceneBspTreeIndexPrivate
          (QGraphicsSceneBspTreeIndexPrivate *this,QGraphicsScene *scene)

{
  QGraphicsSceneIndexPrivate::QGraphicsSceneIndexPrivate
            (&this->super_QGraphicsSceneIndexPrivate,scene);
  *(undefined ***)&this->super_QGraphicsSceneIndexPrivate =
       &PTR__QGraphicsSceneBspTreeIndexPrivate_00813a30;
  QGraphicsSceneBspTree::QGraphicsSceneBspTree(&this->bsp);
  *(undefined8 *)((long)&(this->sceneRect).h + 1) = 0;
  *(undefined8 *)((long)&this->bspTreeDepth + 1) = 0;
  (this->sceneRect).w = 0.0;
  (this->sceneRect).h = 0.0;
  (this->sceneRect).xp = 0.0;
  (this->sceneRect).yp = 0.0;
  this->regenerateIndex = true;
  (this->removedItems).q_hash.d = (Data *)0x0;
  this->sortCacheEnabled = false;
  this->updatingSortCache = false;
  *(undefined8 *)&this->lastItemCount = 0;
  *(undefined8 *)((long)&(this->indexedItems).d.d + 4) = 0;
  *(undefined8 *)((long)&(this->indexedItems).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->indexedItems).d.size + 4) = 0;
  *(undefined8 *)((long)&(this->unindexedItems).d.d + 4) = 0;
  *(undefined8 *)((long)&(this->unindexedItems).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->unindexedItems).d.size + 4) = 0;
  *(undefined8 *)((long)&(this->untransformableItems).d.d + 4) = 0;
  *(undefined8 *)((long)&(this->untransformableItems).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->untransformableItems).d.size + 4) = 0;
  *(undefined8 *)((long)&(this->freeItemIndexes).d.d + 4) = 0;
  *(undefined8 *)((long)&(this->freeItemIndexes).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->freeItemIndexes).d.size + 1) = 0;
  return;
}

Assistant:

QGraphicsSceneBspTreeIndexPrivate::QGraphicsSceneBspTreeIndexPrivate(QGraphicsScene *scene)
    : QGraphicsSceneIndexPrivate(scene),
    bspTreeDepth(0),
    restartIndexTimer(false),
    regenerateIndex(true),
    lastItemCount(0),
    purgePending(false),
    sortCacheEnabled(false),
    updatingSortCache(false)
{
}